

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O1

void exchangeIntMat(char **mat,char *bufIn,char *bufOut,lattice *grid,MPI_Comm Region)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int next;
  int prev;
  MPI_Comm local_58;
  ulong local_50;
  MPI_Status st;
  
  if (Region != (MPI_Comm)&ompi_mpi_comm_world) {
    local_50 = (ulong)(uint)grid->deli;
    iVar3 = grid->delj + 2;
    MPI_Cart_shift(Region,0,1,&prev,&next);
    if (-1 < prev) {
      MPI_Sendrecv(mat[1],iVar3,&ompi_mpi_char,prev,0x65,*mat,iVar3,&ompi_mpi_char,prev,0x66,Region,
                   &st);
    }
    if (-1 < next) {
      MPI_Sendrecv(mat[grid->deli],iVar3,&ompi_mpi_char,next,0x66,mat[(long)grid->deli + 1],iVar3,
                   &ompi_mpi_char,next,0x65,Region,&st);
    }
    iVar3 = (int)local_50;
    uVar4 = iVar3 + 2;
    local_58 = Region;
    MPI_Cart_shift(Region,1,1,&prev,&next);
    if (-1 < prev) {
      if (-2 < iVar3) {
        uVar1 = 1;
        if (1 < (int)uVar4) {
          uVar1 = (ulong)uVar4;
        }
        uVar2 = 0;
        do {
          bufIn[uVar2] = mat[uVar2][1];
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      MPI_Sendrecv(bufIn,uVar4,&ompi_mpi_char,prev,0x67,bufOut,uVar4,&ompi_mpi_char,prev,0x68,
                   local_58,&st);
      if (-2 < iVar3) {
        uVar1 = 1;
        if (1 < (int)uVar4) {
          uVar1 = (ulong)uVar4;
        }
        uVar2 = 0;
        do {
          *mat[uVar2] = bufOut[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
    }
    if (-1 < next) {
      if (-2 < iVar3) {
        uVar1 = 1;
        if (1 < (int)uVar4) {
          uVar1 = (ulong)uVar4;
        }
        uVar2 = 0;
        do {
          bufIn[uVar2] = mat[uVar2][grid->delj];
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      MPI_Sendrecv(bufIn,uVar4,&ompi_mpi_char,next,0x68,bufOut,uVar4,&ompi_mpi_char,next,0x67,
                   local_58,&st);
      if (-2 < iVar3) {
        uVar1 = 1;
        if (1 < (int)uVar4) {
          uVar1 = (ulong)uVar4;
        }
        uVar2 = 0;
        do {
          mat[uVar2][(long)grid->delj + 1] = bufOut[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
    }
  }
  return;
}

Assistant:

void exchangeIntMat (char **mat, char *bufIn, char *bufOut, lattice *grid, MPI_Comm Region)
{
	if (Region == MPI_COMM_WORLD)
		return;
	int prev, next;
	MPI_Status st;
	int lx = grid->deli+2;
	int ly = grid->delj+2;
	/* Left and right */
	MPI_Cart_shift(Region,0,1,&prev,&next);
	if (prev >= 0)
		MPI_Sendrecv(mat[1],ly,MPI_CHAR,prev,101,mat[0],ly,MPI_CHAR,prev,102,Region,&st);
	if (next >= 0)
		MPI_Sendrecv(mat[grid->deli],ly,MPI_CHAR,next,102,mat[grid->deli+1],ly,MPI_CHAR,next,101,Region,&st);
	/* Up and Down */
	MPI_Cart_shift(Region,1,1,&prev,&next);
	if (prev >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][1];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,prev,103,bufOut,lx,MPI_CHAR,prev,104,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][0] = bufOut[i];
	}
	if (next >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][grid->delj];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,next,104,bufOut,lx,MPI_CHAR,next,103,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][grid->delj+1] = bufOut[i];
	}
	return;
}